

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_NtkWriteLatch(FILE *pFile,Abc_Obj_t *pLatch)

{
  int iVar1;
  void **ppvVar2;
  long *plVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  
  ppvVar2 = pLatch->pNtk->vObjs->pArray;
  plVar3 = (long *)ppvVar2[*(pLatch->vFanins).pArray];
  pObj = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
  plVar3 = (long *)ppvVar2[*(pLatch->vFanouts).pArray];
  pObj_00 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
  iVar1 = (pLatch->field_5).iData;
  fwrite(".latch",6,1,(FILE *)pFile);
  pcVar4 = Abc_ObjName(pObj);
  fprintf((FILE *)pFile," %10s",pcVar4);
  pcVar4 = Abc_ObjName(pObj_00);
  fprintf((FILE *)pFile," %10s",pcVar4);
  fprintf((FILE *)pFile,"  %d\n",(ulong)(iVar1 - 1));
  return;
}

Assistant:

void Io_NtkWriteLatch( FILE * pFile, Abc_Obj_t * pLatch )
{
    Abc_Obj_t * pNetLi, * pNetLo;
    int Reset;
    pNetLi = Abc_ObjFanin0( Abc_ObjFanin0(pLatch) );
    pNetLo = Abc_ObjFanout0( Abc_ObjFanout0(pLatch) );
    Reset  = (int)(ABC_PTRUINT_T)Abc_ObjData( pLatch );
    // write the latch line
    fprintf( pFile, ".latch" );
    fprintf( pFile, " %10s",    Abc_ObjName(pNetLi) );
    fprintf( pFile, " %10s",    Abc_ObjName(pNetLo) );
    fprintf( pFile, "  %d\n",   Reset-1 );
}